

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LocalAccessChainConvertPass::InitExtensions(LocalAccessChainConvertPass *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_808;
  allocator<char> local_7fd;
  allocator<char> local_7fc;
  allocator<char> local_7fb;
  allocator<char> local_7fa;
  allocator<char> local_7f9;
  allocator<char> local_7f8;
  allocator<char> local_7f7;
  allocator<char> local_7f6;
  allocator<char> local_7f5;
  allocator<char> local_7f4;
  allocator<char> local_7f3;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  allocator<char> local_7f0;
  allocator<char> local_7ef;
  allocator<char> local_7ee;
  allocator<char> local_7ed;
  allocator<char> local_7ec;
  allocator<char> local_7eb;
  allocator<char> local_7ea;
  allocator<char> local_7e9;
  allocator<char> local_7e8;
  allocator<char> local_7e7;
  allocator<char> local_7e6;
  allocator<char> local_7e5;
  allocator<char> local_7e4;
  allocator<char> local_7e3;
  allocator<char> local_7e2;
  allocator<char> local_7e1;
  allocator<char> local_7e0;
  allocator<char> local_7df;
  allocator<char> local_7de;
  allocator<char> local_7dd;
  allocator<char> local_7dc;
  allocator<char> local_7db;
  allocator<char> local_7da;
  allocator<char> local_7d9;
  allocator<char> local_7d8;
  allocator<char> local_7d7;
  allocator<char> local_7d6;
  allocator<char> local_7d5;
  allocator<char> local_7d4;
  allocator<char> local_7d3;
  allocator<char> local_7d2;
  allocator<char> local_7d1;
  allocator<char> local_7d0;
  allocator<char> local_7cf;
  allocator<char> local_7ce;
  allocator<char> local_7cd;
  allocator<char> local_7cc;
  allocator<char> local_7cb;
  allocator<char> local_7ca;
  allocator<char> local_7c9;
  allocator<char> local_7c8;
  allocator<char> local_7c7;
  allocator<char> local_7c6;
  allocator<char> local_7c5;
  allocator<char> local_7c4;
  allocator<char> local_7c3;
  allocator<char> local_7c2;
  allocator<char> local_7c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  string asStack_7a0 [32];
  string asStack_780 [32];
  string asStack_760 [32];
  string asStack_740 [32];
  string asStack_720 [32];
  string asStack_700 [32];
  string asStack_6e0 [32];
  string asStack_6c0 [32];
  string asStack_6a0 [32];
  string asStack_680 [32];
  string asStack_660 [32];
  string asStack_640 [32];
  string asStack_620 [32];
  string asStack_600 [32];
  string asStack_5e0 [32];
  string asStack_5c0 [32];
  string asStack_5a0 [32];
  string asStack_580 [32];
  string asStack_560 [32];
  string asStack_540 [32];
  string asStack_520 [32];
  string asStack_500 [32];
  string asStack_4e0 [32];
  string asStack_4c0 [32];
  string asStack_4a0 [32];
  string asStack_480 [32];
  string asStack_460 [32];
  string asStack_440 [32];
  string asStack_420 [32];
  string asStack_400 [32];
  string asStack_3e0 [32];
  string asStack_3c0 [32];
  string asStack_3a0 [32];
  string asStack_380 [32];
  string asStack_360 [32];
  string asStack_340 [32];
  string asStack_320 [32];
  string asStack_300 [32];
  string asStack_2e0 [32];
  string asStack_2c0 [32];
  string asStack_2a0 [32];
  string asStack_280 [32];
  string asStack_260 [32];
  string asStack_240 [32];
  string asStack_220 [32];
  string asStack_200 [32];
  string asStack_1e0 [32];
  string asStack_1c0 [32];
  string asStack_1a0 [32];
  string asStack_180 [32];
  string asStack_160 [32];
  string asStack_140 [32];
  string asStack_120 [32];
  string asStack_100 [32];
  string asStack_e0 [32];
  string asStack_c0 [32];
  string asStack_a0 [32];
  string asStack_80 [32];
  string asStack_60 [32];
  string asStack_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  LocalAccessChainConvertPass *this_local;
  
  local_10 = (undefined1  [8])this;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->extensions_allowlist_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"SPV_AMD_shader_explicit_vertex_parameter",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_7a0,"SPV_AMD_shader_trinary_minmax",&local_7c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_780,"SPV_AMD_gcn_shader",&local_7c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_760,"SPV_KHR_shader_ballot",&local_7c4)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_740,"SPV_AMD_shader_ballot",&local_7c5)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_720,"SPV_AMD_gpu_shader_half_float",&local_7c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_700,"SPV_KHR_shader_draw_parameters",&local_7c7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6e0,"SPV_KHR_subgroup_vote",&local_7c8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6c0,"SPV_KHR_8bit_storage",&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6a0,"SPV_KHR_16bit_storage",&local_7ca)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_680,"SPV_KHR_device_group",&local_7cb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_660,"SPV_KHR_multiview",&local_7cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_640,"SPV_NVX_multiview_per_view_attributes",&local_7cd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_620,"SPV_NV_viewport_array2",&local_7ce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_600,"SPV_NV_stereo_view_rendering",&local_7cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5e0,"SPV_NV_sample_mask_override_coverage",&local_7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5c0,"SPV_NV_geometry_shader_passthrough",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5a0,"SPV_AMD_texture_gather_bias_lod",&local_7d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_580,"SPV_KHR_storage_buffer_storage_class",&local_7d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_560,"SPV_AMD_gpu_shader_int16",&local_7d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_540,"SPV_KHR_post_depth_coverage",&local_7d5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_520,"SPV_KHR_shader_atomic_counter_ops",&local_7d6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_500,"SPV_EXT_shader_stencil_export",&local_7d7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4e0,"SPV_EXT_shader_viewport_index_layer",&local_7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4c0,"SPV_AMD_shader_image_load_store_lod",&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4a0,"SPV_AMD_shader_fragment_mask",&local_7da);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_480,"SPV_EXT_fragment_fully_covered",&local_7db);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_460,"SPV_AMD_gpu_shader_half_float_fetch",&local_7dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_440,"SPV_GOOGLE_decorate_string",&local_7dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_420,"SPV_GOOGLE_hlsl_functionality1",&local_7de);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_400,"SPV_GOOGLE_user_type",&local_7df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3e0,"SPV_NV_shader_subgroup_partitioned",&local_7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3c0,"SPV_EXT_demote_to_helper_invocation",&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3a0,"SPV_EXT_descriptor_indexing",&local_7e2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_380,"SPV_NV_fragment_shader_barycentric",&local_7e3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_360,"SPV_NV_compute_shader_derivatives",&local_7e4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_340,"SPV_NV_shader_image_footprint",&local_7e5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_320,"SPV_NV_shading_rate",&local_7e6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_300,"SPV_NV_mesh_shader",&local_7e7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2e0,"SPV_EXT_mesh_shader",&local_7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2c0,"SPV_NV_ray_tracing",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2a0,"SPV_KHR_ray_tracing",&local_7ea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_280,"SPV_KHR_ray_query",&local_7eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_260,"SPV_EXT_fragment_invocation_density",&local_7ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_240,"SPV_KHR_terminate_invocation",&local_7ed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_220,"SPV_KHR_subgroup_uniform_control_flow",&local_7ee);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_200,"SPV_KHR_integer_dot_product",&local_7ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1e0,"SPV_EXT_shader_image_int64",&local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1c0,"SPV_KHR_non_semantic_info",&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1a0,"SPV_KHR_uniform_group_instructions",&local_7f2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_180,"SPV_KHR_fragment_shader_barycentric",&local_7f3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_160,"SPV_KHR_vulkan_memory_model",&local_7f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_140,"SPV_NV_bindless_texture",&local_7f5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_120,"SPV_EXT_shader_atomic_float_add",&local_7f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_100,"SPV_EXT_fragment_shader_interlock",&local_7f7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_e0,"SPV_KHR_compute_shader_derivatives",&local_7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_c0,"SPV_NV_cooperative_matrix",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a0,"SPV_KHR_cooperative_matrix",&local_7fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_80,"SPV_KHR_ray_tracing_position_fetch",&local_7fb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_60,"SPV_AMDX_shader_enqueue",&local_7fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_40,"SPV_KHR_fragment_shading_rate",&local_7fd);
  local_20 = &local_7c0;
  local_18 = 0x3d;
  __l._M_len = 0x3d;
  __l._M_array = local_20;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->extensions_allowlist_,__l);
  local_808 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_808 = local_808 + -1;
    std::__cxx11::string::~string((string *)local_808);
  } while (local_808 != &local_7c0);
  std::allocator<char>::~allocator(&local_7fd);
  std::allocator<char>::~allocator(&local_7fc);
  std::allocator<char>::~allocator(&local_7fb);
  std::allocator<char>::~allocator(&local_7fa);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::~allocator(&local_7f8);
  std::allocator<char>::~allocator(&local_7f7);
  std::allocator<char>::~allocator(&local_7f6);
  std::allocator<char>::~allocator(&local_7f5);
  std::allocator<char>::~allocator(&local_7f4);
  std::allocator<char>::~allocator(&local_7f3);
  std::allocator<char>::~allocator(&local_7f2);
  std::allocator<char>::~allocator(&local_7f1);
  std::allocator<char>::~allocator(&local_7f0);
  std::allocator<char>::~allocator(&local_7ef);
  std::allocator<char>::~allocator(&local_7ee);
  std::allocator<char>::~allocator(&local_7ed);
  std::allocator<char>::~allocator(&local_7ec);
  std::allocator<char>::~allocator(&local_7eb);
  std::allocator<char>::~allocator(&local_7ea);
  std::allocator<char>::~allocator(&local_7e9);
  std::allocator<char>::~allocator(&local_7e8);
  std::allocator<char>::~allocator(&local_7e7);
  std::allocator<char>::~allocator(&local_7e6);
  std::allocator<char>::~allocator(&local_7e5);
  std::allocator<char>::~allocator(&local_7e4);
  std::allocator<char>::~allocator(&local_7e3);
  std::allocator<char>::~allocator(&local_7e2);
  std::allocator<char>::~allocator(&local_7e1);
  std::allocator<char>::~allocator(&local_7e0);
  std::allocator<char>::~allocator(&local_7df);
  std::allocator<char>::~allocator(&local_7de);
  std::allocator<char>::~allocator(&local_7dd);
  std::allocator<char>::~allocator(&local_7dc);
  std::allocator<char>::~allocator(&local_7db);
  std::allocator<char>::~allocator(&local_7da);
  std::allocator<char>::~allocator(&local_7d9);
  std::allocator<char>::~allocator(&local_7d8);
  std::allocator<char>::~allocator(&local_7d7);
  std::allocator<char>::~allocator(&local_7d6);
  std::allocator<char>::~allocator(&local_7d5);
  std::allocator<char>::~allocator(&local_7d4);
  std::allocator<char>::~allocator(&local_7d3);
  std::allocator<char>::~allocator(&local_7d2);
  std::allocator<char>::~allocator(&local_7d1);
  std::allocator<char>::~allocator(&local_7d0);
  std::allocator<char>::~allocator(&local_7cf);
  std::allocator<char>::~allocator(&local_7ce);
  std::allocator<char>::~allocator(&local_7cd);
  std::allocator<char>::~allocator(&local_7cc);
  std::allocator<char>::~allocator(&local_7cb);
  std::allocator<char>::~allocator(&local_7ca);
  std::allocator<char>::~allocator(&local_7c9);
  std::allocator<char>::~allocator(&local_7c8);
  std::allocator<char>::~allocator(&local_7c7);
  std::allocator<char>::~allocator(&local_7c6);
  std::allocator<char>::~allocator(&local_7c5);
  std::allocator<char>::~allocator(&local_7c4);
  std::allocator<char>::~allocator(&local_7c3);
  std::allocator<char>::~allocator(&local_7c2);
  std::allocator<char>::~allocator(&local_7c1);
  return;
}

Assistant:

void LocalAccessChainConvertPass::InitExtensions() {
  extensions_allowlist_.clear();
  extensions_allowlist_.insert(
      {"SPV_AMD_shader_explicit_vertex_parameter",
       "SPV_AMD_shader_trinary_minmax", "SPV_AMD_gcn_shader",
       "SPV_KHR_shader_ballot", "SPV_AMD_shader_ballot",
       "SPV_AMD_gpu_shader_half_float", "SPV_KHR_shader_draw_parameters",
       "SPV_KHR_subgroup_vote", "SPV_KHR_8bit_storage", "SPV_KHR_16bit_storage",
       "SPV_KHR_device_group", "SPV_KHR_multiview",
       "SPV_NVX_multiview_per_view_attributes", "SPV_NV_viewport_array2",
       "SPV_NV_stereo_view_rendering", "SPV_NV_sample_mask_override_coverage",
       "SPV_NV_geometry_shader_passthrough", "SPV_AMD_texture_gather_bias_lod",
       "SPV_KHR_storage_buffer_storage_class",
       // SPV_KHR_variable_pointers
       //   Currently do not support extended pointer expressions
       "SPV_AMD_gpu_shader_int16", "SPV_KHR_post_depth_coverage",
       "SPV_KHR_shader_atomic_counter_ops", "SPV_EXT_shader_stencil_export",
       "SPV_EXT_shader_viewport_index_layer",
       "SPV_AMD_shader_image_load_store_lod", "SPV_AMD_shader_fragment_mask",
       "SPV_EXT_fragment_fully_covered", "SPV_AMD_gpu_shader_half_float_fetch",
       "SPV_GOOGLE_decorate_string", "SPV_GOOGLE_hlsl_functionality1",
       "SPV_GOOGLE_user_type", "SPV_NV_shader_subgroup_partitioned",
       "SPV_EXT_demote_to_helper_invocation", "SPV_EXT_descriptor_indexing",
       "SPV_NV_fragment_shader_barycentric",
       "SPV_NV_compute_shader_derivatives", "SPV_NV_shader_image_footprint",
       "SPV_NV_shading_rate", "SPV_NV_mesh_shader", "SPV_EXT_mesh_shader",
       "SPV_NV_ray_tracing", "SPV_KHR_ray_tracing", "SPV_KHR_ray_query",
       "SPV_EXT_fragment_invocation_density", "SPV_KHR_terminate_invocation",
       "SPV_KHR_subgroup_uniform_control_flow", "SPV_KHR_integer_dot_product",
       "SPV_EXT_shader_image_int64", "SPV_KHR_non_semantic_info",
       "SPV_KHR_uniform_group_instructions",
       "SPV_KHR_fragment_shader_barycentric", "SPV_KHR_vulkan_memory_model",
       "SPV_NV_bindless_texture", "SPV_EXT_shader_atomic_float_add",
       "SPV_EXT_fragment_shader_interlock",
       "SPV_KHR_compute_shader_derivatives", "SPV_NV_cooperative_matrix",
       "SPV_KHR_cooperative_matrix", "SPV_KHR_ray_tracing_position_fetch",
       "SPV_AMDX_shader_enqueue", "SPV_KHR_fragment_shading_rate"});
}